

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshConstruct(FmsMesh *mesh)

{
  int iVar1;
  FmsMesh pFVar2;
  
  if (mesh != (FmsMesh *)0x0) {
    pFVar2 = (FmsMesh)calloc(1,0x58);
    if (pFVar2 == (FmsMesh)0x0) {
      iVar1 = 2;
    }
    else {
      pFVar2->num_partitions = 1;
      *mesh = pFVar2;
      iVar1 = 0;
    }
    return iVar1;
  }
  return 1;
}

Assistant:

int FmsMeshConstruct(FmsMesh *mesh) {
  if (!mesh) { E_RETURN(1); }
  FmsMesh m;
  m = calloc(1, sizeof(*m));
  if (!m) { E_RETURN(2); }
  m->num_partitions = 1;
  *mesh = m;
  return 0;
}